

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::
AddTestPattern(ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest> *this,
              char *test_suite_name,char *test_base_name,
              TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
              *meta_factory,CodeLocation *code_location)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  pointer psVar7;
  pointer psVar8;
  pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar10;
  ulong uVar11;
  size_type __dnew;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  int local_40;
  _func_int *local_38;
  
  peVar3 = (element_type *)operator_new(0x70);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,meta_factory->_vptr_TestMetaFactoryBase,
             (long)meta_factory[1]._vptr_TestMetaFactoryBase +
             (long)meta_factory->_vptr_TestMetaFactoryBase);
  local_40 = *(int *)&meta_factory[4]._vptr_TestMetaFactoryBase;
  (peVar3->test_suite_base_name)._M_dataplus._M_p = (pointer)&(peVar3->test_suite_base_name).field_2
  ;
  local_38 = (_func_int *)0x18;
  pcVar4 = (char *)std::__cxx11::string::_M_create((ulong *)peVar3,(ulong)&local_38);
  (peVar3->test_suite_base_name)._M_dataplus._M_p = pcVar4;
  (peVar3->test_suite_base_name).field_2._M_allocated_capacity = (size_type)local_38;
  builtin_strncpy(pcVar4,"AV1HighbdCompAvgPredTest",0x18);
  (peVar3->test_suite_base_name)._M_string_length = (size_type)local_38;
  local_38[(long)(peVar3->test_suite_base_name)._M_dataplus._M_p] = (_func_int)0x0;
  std::__cxx11::string::string
            ((string *)&peVar3->test_base_name,test_suite_name,(allocator *)&local_38);
  (peVar3->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>_*,_false>
       = (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>_*,_false>
          )test_base_name;
  (peVar3->code_location).file._M_dataplus._M_p = (pointer)&(peVar3->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar3->code_location,local_60,local_60 + local_58);
  (peVar3->code_location).line = local_40;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_010a1370;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)peVar3;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == (this->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar2 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)psVar1 - (long)psVar2 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (long)psVar1 - (long)psVar2 >> 4;
    uVar6 = 1;
    if (psVar1 != psVar2) {
      uVar6 = uVar10;
    }
    uVar11 = uVar6 + uVar10;
    if (0x7fffffffffffffe < uVar11) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar6,uVar10)) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (uVar11 == 0) {
      psVar7 = (pointer)0x0;
    }
    else {
      psVar7 = (pointer)operator_new(uVar11 << 4);
    }
    psVar7[uVar10].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    psVar7[uVar10].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    psVar9 = psVar7;
    for (psVar8 = psVar2; psVar1 != psVar8; psVar8 = psVar8 + 1) {
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar3 = (psVar8->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var5 = (psVar8->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar3;
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var5;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar9 = psVar9 + 1;
    }
    if (psVar2 != (pointer)0x0) {
      operator_delete(psVar2);
    }
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar7;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar9 + 1;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar7 + uVar11;
  }
  else {
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar3;
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var5;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdCompAvgPredTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }